

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvgrast.h
# Opt level: O3

void nsvg__initPaint(NSVGcachedPaint *cache,NSVGpaint *paint,float opacity)

{
  float fVar1;
  char cVar2;
  uint uVar3;
  NSVGgradient *pNVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  int iu;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int iu_1;
  int iVar12;
  int iVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar18;
  int iVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar22;
  float fVar23;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  long lVar17;
  
  cVar2 = paint->type;
  cache->type = cVar2;
  if (cVar2 == '\x01') {
    fVar22 = 1.0;
    if (opacity <= 1.0) {
      fVar22 = opacity;
    }
    cache->colors[0] =
         ((paint->field_1).color >> 8 & 0xff0000) *
         (int)(float)(~-(uint)(opacity < 0.0) & (uint)(fVar22 * 256.0)) & 0xff000000 |
         (paint->field_1).color & 0xffffff;
  }
  else {
    pNVar4 = (paint->field_1).gradient;
    cache->spread = pNVar4->spread;
    *(undefined8 *)(cache->xform + 4) = *(undefined8 *)(pNVar4->xform + 4);
    uVar5 = *(undefined8 *)(pNVar4->xform + 2);
    *(undefined8 *)cache->xform = *(undefined8 *)pNVar4->xform;
    *(undefined8 *)(cache->xform + 2) = uVar5;
    iVar7 = pNVar4->nstops;
    if (iVar7 == 0) {
      memset(cache->colors,0,0x400);
      iVar7 = pNVar4->nstops;
    }
    auVar20 = _DAT_00122800;
    auVar6 = _DAT_00122790;
    if (iVar7 == 1) {
      fVar22 = 1.0;
      if (opacity <= 1.0) {
        fVar22 = opacity;
      }
      lVar9 = 0;
      do {
        uVar8 = pNVar4->stops[lVar9].color;
        cache->colors[lVar9] =
             (uVar8 >> 8 & 0xff0000) *
             (int)(float)(~-(uint)(opacity < 0.0) & (uint)(fVar22 * 256.0)) & 0xff000000 |
             uVar8 & 0xffffff;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x100);
    }
    else {
      fVar22 = 1.0;
      if (opacity <= 1.0) {
        fVar22 = opacity;
      }
      iVar12 = (int)(float)(~-(uint)(opacity < 0.0) & (uint)(fVar22 * 256.0));
      fVar22 = pNVar4->stops[0].offset;
      fVar14 = 1.0;
      if (fVar22 <= 1.0) {
        fVar14 = fVar22;
      }
      fVar14 = (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar14);
      fVar1 = pNVar4->stops[(long)iVar7 + -1].offset;
      uVar8 = (uint)(fVar14 * 255.0);
      if (0 < (int)uVar8) {
        uVar10 = pNVar4->stops[0].color;
        uVar10 = (uVar10 >> 8 & 0xff0000) * iVar12 & 0xff000000 | uVar10 & 0xffffff;
        lVar9 = (ulong)uVar8 - 1;
        auVar15._8_4_ = (int)lVar9;
        auVar15._0_8_ = lVar9;
        auVar15._12_4_ = (int)((ulong)lVar9 >> 0x20);
        lVar9 = 0;
        auVar15 = auVar15 ^ _DAT_00122790;
        auVar16 = _DAT_001227e0;
        auVar19 = _DAT_001227f0;
        do {
          auVar26 = auVar19 ^ auVar6;
          iVar7 = auVar15._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar7 && auVar15._0_4_ < auVar26._0_4_ ||
                      iVar7 < auVar26._4_4_) & 1)) {
            *(uint *)((long)cache->colors + lVar9) = uVar10;
          }
          if ((auVar26._12_4_ != auVar15._12_4_ || auVar26._8_4_ <= auVar15._8_4_) &&
              auVar26._12_4_ <= auVar15._12_4_) {
            *(uint *)((long)cache->colors + lVar9 + 4) = uVar10;
          }
          auVar26 = auVar16 ^ auVar6;
          iVar18 = auVar26._4_4_;
          if (iVar18 <= iVar7 && (iVar18 != iVar7 || auVar26._0_4_ <= auVar15._0_4_)) {
            *(uint *)((long)cache->colors + lVar9 + 8) = uVar10;
            *(uint *)((long)cache->colors + lVar9 + 0xc) = uVar10;
          }
          lVar17 = auVar19._8_8_;
          lVar24 = auVar20._0_8_;
          auVar19._0_8_ = auVar19._0_8_ + lVar24;
          lVar25 = auVar20._8_8_;
          auVar19._8_8_ = lVar17 + lVar25;
          lVar17 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + lVar24;
          auVar16._8_8_ = lVar17 + lVar25;
          lVar9 = lVar9 + 0x10;
        } while ((ulong)(uVar8 + 3 >> 2) << 4 != lVar9);
        iVar7 = pNVar4->nstops;
      }
      auVar6 = _DAT_00122780;
      if (iVar7 < 2) {
        fVar22 = 1.0;
        if (fVar1 <= 1.0) {
          fVar22 = fVar1;
        }
        iVar18 = (int)((float)(~-(uint)(fVar1 < fVar14) & (uint)fVar22 |
                              -(uint)(fVar1 < fVar14) & (uint)fVar14) * 255.0);
        fVar22 = 0.0;
      }
      else {
        lVar9 = 0;
        do {
          fVar1 = pNVar4[1].xform[lVar9 * 2];
          uVar8 = ((uint)fVar1 >> 8 & 0xff0000) * iVar12;
          fVar14 = pNVar4[1].stops[lVar9 + -5].offset;
          auVar20._4_4_ = fVar22;
          auVar20._0_4_ = fVar14;
          auVar20._8_8_ = 0;
          auVar20 = minps(auVar6,auVar20);
          iVar18 = (int)(float)(-(uint)(0.0 <= fVar14) & (uint)(auVar20._0_4_ * 255.0));
          iVar21 = (int)(float)(-(uint)(0.0 <= fVar22) & (uint)(auVar20._4_4_ * 255.0));
          uVar10 = iVar18 - iVar21;
          if (uVar10 != 0 && iVar21 <= iVar18) {
            uVar3 = pNVar4->stops[lVar9].color;
            fVar22 = 0.0;
            uVar11 = 0;
            do {
              fVar23 = 1.0;
              if (fVar22 <= 1.0) {
                fVar23 = fVar22;
              }
              iVar13 = (int)(float)(~-(uint)(fVar22 < 0.0) & (uint)(fVar23 * 256.0));
              iVar7 = 0x100 - iVar13;
              cache->colors[(long)iVar21 + uVar11] =
                   (iVar13 * (uVar8 >> 0x18) + iVar7 * ((uVar3 >> 8 & 0xff0000) * iVar12 >> 0x18) &
                   0xff00) << 0x10 |
                   (((uint)fVar1 >> 0x10 & 0xff) * iVar13 + iVar7 * (uVar3 >> 0x10 & 0xff) & 0xff00)
                   << 8 | ((uint)fVar1 >> 8 & 0xff) * iVar13 + iVar7 * (uVar3 >> 8 & 0xff) & 0xff00
                          | ((uint)fVar1 & 0xff) * iVar13 + iVar7 * (uVar3 & 0xff) >> 8 & 0xff;
              fVar22 = fVar22 + 1.0 / (float)(int)uVar10;
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
            iVar7 = pNVar4->nstops;
          }
          lVar9 = lVar9 + 1;
          fVar22 = fVar14;
        } while (lVar9 < iVar7 + -1);
        fVar22 = (float)(uVar8 & 0xff000000 | (uint)fVar1 & 0xffffff);
      }
      if (iVar18 < 0x100) {
        lVar9 = (long)iVar18 + 7;
        do {
          cache->xform[lVar9 + -1] = fVar22;
          iVar7 = (int)lVar9;
          lVar9 = lVar9 + 1;
        } while (iVar7 != 0x106);
      }
    }
  }
  return;
}

Assistant:

static void nsvg__initPaint(NSVGcachedPaint* cache, NSVGpaint* paint, float opacity)
{
	int i, j;
	NSVGgradient* grad;

	cache->type = paint->type;

	if (paint->type == NSVG_PAINT_COLOR) {
		cache->colors[0] = nsvg__applyOpacity(paint->color, opacity);
		return;
	}

	grad = paint->gradient;

	cache->spread = grad->spread;
	memcpy(cache->xform, grad->xform, sizeof(float)*6);

	if (grad->nstops == 0) {
		for (i = 0; i < 256; i++)
			cache->colors[i] = 0;
	} if (grad->nstops == 1) {
		for (i = 0; i < 256; i++)
			cache->colors[i] = nsvg__applyOpacity(grad->stops[i].color, opacity);
	} else {
		unsigned int ca, cb = 0;
		float ua, ub, du, u;
		int ia, ib, count;

		ca = nsvg__applyOpacity(grad->stops[0].color, opacity);
		ua = nsvg__clampf(grad->stops[0].offset, 0, 1);
		ub = nsvg__clampf(grad->stops[grad->nstops-1].offset, ua, 1);
		ia = (int)(ua * 255.0f);
		ib = (int)(ub * 255.0f);
		for (i = 0; i < ia; i++) {
			cache->colors[i] = ca;
		}

		for (i = 0; i < grad->nstops-1; i++) {
			ca = nsvg__applyOpacity(grad->stops[i].color, opacity);
			cb = nsvg__applyOpacity(grad->stops[i+1].color, opacity);
			ua = nsvg__clampf(grad->stops[i].offset, 0, 1);
			ub = nsvg__clampf(grad->stops[i+1].offset, 0, 1);
			ia = (int)(ua * 255.0f);
			ib = (int)(ub * 255.0f);
			count = ib - ia;
			if (count <= 0) continue;
			u = 0;
			du = 1.0f / (float)count;
			for (j = 0; j < count; j++) {
				cache->colors[ia+j] = nsvg__lerpRGBA(ca,cb,u);
				u += du;
			}
		}

		for (i = ib; i < 256; i++)
			cache->colors[i] = cb;
	}

}